

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminatePivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int prow,int pos,
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int p_col;
  int iVar6;
  fpclass_type fVar7;
  int32_t iVar8;
  int *piVar9;
  pointer pnVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int *piVar14;
  Pring *pPVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  int32_t iVar31;
  int *piVar32;
  int iVar33;
  int iVar34;
  int *piVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar9 = (this->u).row.len;
  iVar4 = (this->u).row.start[prow];
  lVar39 = (long)iVar4;
  iVar5 = piVar9[prow];
  iVar34 = (int)((long)iVar5 + -1);
  piVar9[prow] = iVar34;
  iVar33 = pos + iVar4;
  pnVar10 = (this->u).row.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  piVar9 = (this->u).row.idx;
  p_col = piVar9[iVar33];
  uVar16 = *(undefined8 *)pnVar10[iVar33].m_backend.data._M_elems;
  uVar17 = *(undefined8 *)((long)pnVar10[iVar33].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x10);
  uVar18 = *(undefined8 *)puVar2;
  uVar19 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x20);
  uVar20 = *(undefined8 *)puVar2;
  uVar21 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x30);
  uVar22 = *(undefined8 *)puVar2;
  uVar23 = *(undefined8 *)(puVar2 + 2);
  iVar6 = pnVar10[iVar33].m_backend.exp;
  bVar3 = pnVar10[iVar33].m_backend.neg;
  fVar7 = pnVar10[iVar33].m_backend.fpclass;
  iVar8 = pnVar10[iVar33].m_backend.prec_elem;
  pPVar11 = (this->temp).pivot_col;
  pPVar12 = pPVar11[p_col].next;
  pPVar12->prev = pPVar11[p_col].prev;
  (pPVar11[p_col].prev)->next = pPVar12;
  pPVar11[p_col].next = pPVar11 + p_col;
  pPVar11[p_col].prev = pPVar11 + p_col;
  lVar37 = (long)(iVar34 + iVar4);
  piVar9[iVar33] = piVar9[lVar37];
  uVar24 = *(undefined8 *)pnVar10[lVar37].m_backend.data._M_elems;
  uVar25 = *(undefined8 *)((long)pnVar10[lVar37].m_backend.data._M_elems + 8);
  puVar2 = (uint *)((long)pnVar10[lVar37].m_backend.data._M_elems + 0x10);
  uVar26 = *(undefined8 *)puVar2;
  uVar27 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar10[lVar37].m_backend.data._M_elems + 0x20);
  uVar28 = *(undefined8 *)puVar2;
  uVar29 = *(undefined8 *)(puVar2 + 2);
  puVar2 = (uint *)((long)pnVar10[lVar37].m_backend.data._M_elems + 0x30);
  uVar30 = *(undefined8 *)(puVar2 + 2);
  puVar1 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x30);
  *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
  *(undefined8 *)(puVar1 + 2) = uVar30;
  puVar2 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x20);
  *(undefined8 *)puVar2 = uVar28;
  *(undefined8 *)(puVar2 + 2) = uVar29;
  puVar2 = (uint *)((long)pnVar10[iVar33].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar2 = uVar26;
  *(undefined8 *)(puVar2 + 2) = uVar27;
  *(undefined8 *)pnVar10[iVar33].m_backend.data._M_elems = uVar24;
  *(undefined8 *)((long)pnVar10[iVar33].m_backend.data._M_elems + 8) = uVar25;
  pnVar10[iVar33].m_backend.exp = pnVar10[lVar37].m_backend.exp;
  pnVar10[iVar33].m_backend.neg = pnVar10[lVar37].m_backend.neg;
  iVar31 = pnVar10[lVar37].m_backend.prec_elem;
  pnVar10[iVar33].m_backend.fpclass = pnVar10[lVar37].m_backend.fpclass;
  pnVar10[iVar33].m_backend.prec_elem = iVar31;
  iVar4 = (this->temp).stage;
  (this->temp).stage = iVar4 + 1;
  local_88.m_backend.data._M_elems._0_8_ = uVar16;
  local_88.m_backend.data._M_elems._8_8_ = uVar17;
  local_88.m_backend.data._M_elems._16_8_ = uVar18;
  local_88.m_backend.data._M_elems._24_8_ = uVar19;
  local_88.m_backend.data._M_elems._32_8_ = uVar20;
  local_88.m_backend.data._M_elems._40_8_ = uVar21;
  local_88.m_backend.data._M_elems._48_8_ = uVar22;
  local_88.m_backend.data._M_elems._56_8_ = uVar23;
  local_88.m_backend.exp = iVar6;
  local_88.m_backend.neg = bVar3;
  local_88.m_backend.fpclass = fVar7;
  local_88.m_backend.prec_elem = iVar8;
  setPivot(this,iVar4,p_col,prow,&local_88);
  iVar4 = (this->temp).s_cact[p_col];
  iVar33 = -1;
  if (1 < iVar4) {
    iVar33 = makeLvec(this,iVar4 + -1,prow);
  }
  if (1 < iVar5) {
    do {
      iVar4 = (this->u).row.idx[lVar39];
      (this->temp).s_mark[iVar4] = 1;
      pnVar10 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar13 = this->work;
      uVar24 = *(undefined8 *)pnVar10[lVar39].m_backend.data._M_elems;
      uVar25 = *(undefined8 *)((long)pnVar10[lVar39].m_backend.data._M_elems + 8);
      puVar2 = (uint *)((long)pnVar10[lVar39].m_backend.data._M_elems + 0x10);
      uVar26 = *(undefined8 *)puVar2;
      uVar27 = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar10[lVar39].m_backend.data._M_elems + 0x20);
      uVar28 = *(undefined8 *)puVar2;
      uVar29 = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)pnVar10[lVar39].m_backend.data._M_elems + 0x30);
      uVar30 = *(undefined8 *)(puVar2 + 2);
      puVar1 = pnVar13[iVar4].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = *(undefined8 *)puVar2;
      *(undefined8 *)(puVar1 + 2) = uVar30;
      puVar2 = pnVar13[iVar4].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar28;
      *(undefined8 *)(puVar2 + 2) = uVar29;
      puVar2 = pnVar13[iVar4].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar26;
      *(undefined8 *)(puVar2 + 2) = uVar27;
      *(undefined8 *)pnVar13[iVar4].m_backend.data._M_elems = uVar24;
      *(undefined8 *)(pnVar13[iVar4].m_backend.data._M_elems + 2) = uVar25;
      pnVar13[iVar4].m_backend.exp = pnVar10[lVar39].m_backend.exp;
      pnVar13[iVar4].m_backend.neg = pnVar10[lVar39].m_backend.neg;
      iVar31 = pnVar10[lVar39].m_backend.prec_elem;
      pnVar13[iVar4].m_backend.fpclass = pnVar10[lVar39].m_backend.fpclass;
      pnVar13[iVar4].m_backend.prec_elem = iVar31;
      pPVar11 = (this->temp).pivot_col;
      pPVar12 = pPVar11[iVar4].next;
      pPVar12->prev = pPVar11[iVar4].prev;
      (pPVar11[iVar4].prev)->next = pPVar12;
      piVar14 = (this->u).col.idx;
      piVar9 = (this->temp).s_cact;
      iVar34 = ((this->u).col.len[iVar4] + (this->u).col.start[iVar4]) - piVar9[iVar4];
      piVar32 = piVar14 + iVar34;
      do {
        piVar35 = piVar32;
        piVar32 = piVar35 + 1;
      } while (*piVar35 != prow);
      *piVar35 = piVar14[iVar34];
      piVar14[iVar34] = prow;
      piVar9 = piVar9 + iVar4;
      *piVar9 = *piVar9 + -1;
      lVar39 = lVar39 + 1;
    } while (lVar39 < lVar37);
  }
  uVar38 = (long)(this->u).col.len[p_col] - (long)(this->temp).s_cact[p_col];
  iVar4 = (this->u).col.idx[(long)(this->u).col.start[p_col] + uVar38];
  while (iVar4 != prow) {
    local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
    local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
    local_d8.m_backend.exp = (eps->m_backend).exp;
    local_d8.m_backend.neg = (eps->m_backend).neg;
    local_d8.m_backend.fpclass = (eps->m_backend).fpclass;
    local_d8.m_backend.prec_elem = (eps->m_backend).prec_elem;
    local_178.m_backend.data._M_elems._0_8_ = uVar16;
    local_178.m_backend.data._M_elems._8_8_ = uVar17;
    local_178.m_backend.data._M_elems._16_8_ = uVar18;
    local_178.m_backend.data._M_elems._24_8_ = uVar19;
    local_178.m_backend.data._M_elems._32_8_ = uVar20;
    local_178.m_backend.data._M_elems._40_8_ = uVar21;
    local_178.m_backend.data._M_elems._48_8_ = uVar22;
    local_178.m_backend.data._M_elems._56_8_ = uVar23;
    local_178.m_backend.exp = iVar6;
    local_178.m_backend.neg = bVar3;
    local_178.m_backend.fpclass = fVar7;
    local_178.m_backend.prec_elem = iVar8;
    updateRow(this,iVar4,iVar33,prow,p_col,&local_178,&local_d8);
    uVar36 = (int)uVar38 + 1;
    uVar38 = (ulong)uVar36;
    iVar33 = iVar33 + 1;
    iVar4 = (this->u).col.idx[(int)((this->u).col.start[p_col] + uVar36)];
  }
  iVar4 = (this->u).col.len[p_col];
  iVar34 = (int)uVar38 + 1;
  if (iVar34 < iVar4) {
    do {
      local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4)
      ;
      local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6)
      ;
      local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8)
      ;
      local_128.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 10);
      local_128.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_128.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_128.m_backend.exp = (eps->m_backend).exp;
      local_128.m_backend.neg = (eps->m_backend).neg;
      local_128.m_backend.fpclass = (eps->m_backend).fpclass;
      local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_1c8.m_backend.data._M_elems._0_8_ = uVar16;
      local_1c8.m_backend.data._M_elems._8_8_ = uVar17;
      local_1c8.m_backend.data._M_elems._16_8_ = uVar18;
      local_1c8.m_backend.data._M_elems._24_8_ = uVar19;
      local_1c8.m_backend.data._M_elems._32_8_ = uVar20;
      local_1c8.m_backend.data._M_elems._40_8_ = uVar21;
      local_1c8.m_backend.data._M_elems._48_8_ = uVar22;
      local_1c8.m_backend.data._M_elems._56_8_ = uVar23;
      local_1c8.m_backend.exp = iVar6;
      local_1c8.m_backend.neg = bVar3;
      local_1c8.m_backend.fpclass = fVar7;
      local_1c8.m_backend.prec_elem = iVar8;
      updateRow(this,(this->u).col.idx[(this->u).col.start[p_col] + iVar34],iVar33,prow,p_col,
                &local_1c8,&local_128);
      iVar34 = iVar34 + 1;
      iVar33 = iVar33 + 1;
    } while (iVar4 != iVar34);
  }
  piVar9 = (this->u).col.len + p_col;
  *piVar9 = *piVar9 - (this->temp).s_cact[p_col];
  if (1 < iVar5) {
    lVar39 = (long)(this->u).row.start[prow];
    lVar37 = (long)iVar5 + -1 + lVar39;
    do {
      iVar4 = (this->u).row.idx[lVar39];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&this->work[iVar4].m_backend,0);
      (this->temp).s_mark[iVar4] = 0;
      pPVar11 = (this->temp).pivot_colNZ;
      pPVar12 = (this->temp).pivot_col;
      iVar5 = (this->temp).s_cact[iVar4];
      pPVar15 = pPVar11[iVar5].next;
      pPVar12[iVar4].next = pPVar15;
      pPVar15->prev = pPVar12 + iVar4;
      pPVar12[iVar4].prev = pPVar11 + iVar5;
      pPVar11[iVar5].next = pPVar12 + iVar4;
      lVar39 = lVar39 + 1;
    } while (lVar39 < lVar37);
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}